

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::TraverseSchema
          (TraverseSchema *this,DOMElement *schemaRoot,XMLStringPool *uriStringPool,
          SchemaGrammar *schemaGrammar,GrammarResolver *grammarResolver,
          RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
          *cachedSchemaInfoList,
          RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *schemaInfoList,
          XMLScanner *xmlScanner,XMLCh *schemaURL,XMLEntityHandler *entityHandler,
          XMLErrorReporter *errorReporter,MemoryManager *manager,bool multipleImport)

{
  SchemaGrammar *pSVar1;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar2;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar3;
  uint uVar4;
  JanitorMemFunCall<xercesc_4_0::TraverseSchema> local_48;
  
  this->fFullConstraintChecking = false;
  this->fTargetNSURI = -1;
  this->fEmptyNamespaceURI = -1;
  this->fCurrentScope = 0xfffffffe;
  uVar4 = schemaGrammar->fAnonTypeCount;
  this->fScopeCount = schemaGrammar->fScopeCount;
  this->fAnonXSTypeCount = uVar4;
  this->fCircularCheckIndex = 0;
  this->fTargetNSURIString = (XMLCh *)0x0;
  this->fDatatypeRegistry = (DatatypeValidatorFactory *)0x0;
  this->fGrammarResolver = grammarResolver;
  this->fSchemaGrammar = schemaGrammar;
  this->fEntityHandler = entityHandler;
  this->fErrorReporter = errorReporter;
  this->fURIStringPool = uriStringPool;
  this->fStringPool = (XMLStringPool *)0x0;
  XMLBuffer::XMLBuffer(&this->fBuffer,0x3ff,manager);
  this->fScanner = xmlScanner;
  memset(&this->fAttributeDeclRegistry,0,0xb0);
  this->fSchemaInfoList = schemaInfoList;
  this->fCachedSchemaInfoList = cachedSchemaInfoList;
  this->fParser = (XSDDOMParser *)0x0;
  XSDErrorReporter::XSDErrorReporter(&this->fXSDErrorReporter,(XMLErrorReporter *)0x0);
  this->fLocator = (XSDLocator *)0x0;
  this->fMemoryManager = manager;
  this->fGrammarPoolMemoryManager = this->fGrammarResolver->fGrammarPool->fMemMgr;
  this->fAnnotation = (XSAnnotation *)0x0;
  GeneralAttributeCheck::GeneralAttributeCheck(&this->fAttributeCheck,manager);
  local_48.fToCall = (MFPT)cleanUp;
  local_48._16_8_ = 0;
  if (((schemaRoot != (DOMElement *)0x0) && (this->fGrammarResolver != (GrammarResolver *)0x0)) &&
     (this->fURIStringPool != (XMLStringPool *)0x0)) {
    local_48.fObject = this;
    init(this,(EVP_PKEY_CTX *)manager);
    if (multipleImport) {
      pSVar1 = this->fSchemaGrammar;
      pRVar2 = pSVar1->fAttGroupInfoRegistry;
      this->fGroupRegistry = pSVar1->fGroupInfoRegistry;
      this->fAttGroupRegistry = pRVar2;
      pRVar3 = pSVar1->fComplexTypeRegistry;
      this->fAttributeDeclRegistry = pSVar1->fAttributeDeclRegistry;
      this->fComplexTypeRegistry = pRVar3;
      this->fValidSubstitutionGroups = pSVar1->fValidSubstitutionGroups;
    }
    preprocessSchema(this,schemaRoot,schemaURL,multipleImport);
    doTraverseSchema(this,schemaRoot);
    uVar4 = this->fAnonXSTypeCount;
    pSVar1 = this->fSchemaGrammar;
    pSVar1->fScopeCount = this->fScopeCount;
    pSVar1->fAnonTypeCount = uVar4;
  }
  local_48.fObject = (TraverseSchema *)0x0;
  JanitorMemFunCall<xercesc_4_0::TraverseSchema>::~JanitorMemFunCall(&local_48);
  return;
}

Assistant:

TraverseSchema::TraverseSchema( DOMElement* const    schemaRoot
                              , XMLStringPool* const   uriStringPool
                              , SchemaGrammar* const   schemaGrammar
                              , GrammarResolver* const grammarResolver
                              , RefHash2KeysTableOf<SchemaInfo>* cachedSchemaInfoList
                              , RefHash2KeysTableOf<SchemaInfo>* schemaInfoList
                              , XMLScanner* const      xmlScanner
                              , const XMLCh* const     schemaURL
                              , XMLEntityHandler* const  entityHandler
                              , XMLErrorReporter* const errorReporter
                              , MemoryManager* const    manager
                              , bool multipleImport)
    : fFullConstraintChecking(false)
    , fTargetNSURI(-1)
    , fEmptyNamespaceURI(-1)
    , fCurrentScope(Grammar::TOP_LEVEL_SCOPE)
    , fScopeCount(schemaGrammar->getScopeCount ())
    , fAnonXSTypeCount(schemaGrammar->getAnonTypeCount ())
    , fCircularCheckIndex(0)
    , fTargetNSURIString(0)
    , fDatatypeRegistry(0)
    , fGrammarResolver(grammarResolver)
    , fSchemaGrammar(schemaGrammar)
    , fEntityHandler(entityHandler)
    , fErrorReporter(errorReporter)
    , fURIStringPool(uriStringPool)
    , fStringPool(0)
    , fBuffer(1023, manager)
    , fScanner(xmlScanner)
    , fAttributeDeclRegistry(0)
    , fComplexTypeRegistry(0)
    , fGroupRegistry(0)
    , fAttGroupRegistry(0)
    , fIC_ElementsNS(0)
    , fPreprocessedNodes(0)
    , fSchemaInfo(0)
    , fCurrentGroupInfo(0)
    , fCurrentAttGroupInfo(0)
    , fCurrentComplexType(0)
    , fCurrentTypeNameStack(0)
    , fCurrentGroupStack(0)
    , fIC_Elements(0)
    , fDeclStack(0)
    , fGlobalDeclarations(0)
    , fNonXSAttList(0)
    , fImportedNSList(0)
    , fIC_NodeListNS(0)
    , fNotationRegistry(0)
    , fRedefineComponents(0)
    , fIdentityConstraintNames(0)
    , fValidSubstitutionGroups(0)
    , fSchemaInfoList(schemaInfoList)
    , fCachedSchemaInfoList (cachedSchemaInfoList)
    , fParser(0)
    , fLocator(0)
    , fMemoryManager(manager)
    , fGrammarPoolMemoryManager(fGrammarResolver->getGrammarPoolMemoryManager())
    , fAnnotation(0)
    , fAttributeCheck(manager)
{
    CleanupType cleanup(this, &TraverseSchema::cleanUp);

    try {

        if (fGrammarResolver && schemaRoot && fURIStringPool) {

            init();

            if (multipleImport)
            {
              // If we are working on an existing schema, do some
              // intitialization that is otherwise done by preprocessSchema.
              //
              fComplexTypeRegistry = fSchemaGrammar->getComplexTypeRegistry();
              fGroupRegistry = fSchemaGrammar->getGroupInfoRegistry();
              fAttGroupRegistry = fSchemaGrammar->getAttGroupInfoRegistry();
              fAttributeDeclRegistry = fSchemaGrammar->getAttributeDeclRegistry();
              fValidSubstitutionGroups = fSchemaGrammar->getValidSubstitutionGroups();
            }

            preprocessSchema(schemaRoot, schemaURL, multipleImport);
            doTraverseSchema(schemaRoot);

            // Store the scope and anon type counts in case we need to add
            // more to this grammar (multi-import case). schemaGrammar and
            // fSchemaGrammar should be the same here.
            //
            fSchemaGrammar->setScopeCount (fScopeCount);
            fSchemaGrammar->setAnonTypeCount (fAnonXSTypeCount);
        }

    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}